

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O1

ostream * eglu::operator<<(ostream *str,ConfigAttribListFmt *fmt)

{
  uint value;
  bool bVar1;
  ConfigAttribValueFmt in_RAX;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  ConfigAttribValueFmt CVar7;
  ConfigAttribValueFmt local_38;
  
  local_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  iVar6 = 0;
  do {
    value = fmt->attribs[iVar6];
    CVar7.value = 0;
    CVar7.attribute = value;
    if (iVar6 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
    }
    if (value == 0x3038) {
      lVar4 = 8;
      pcVar5 = "EGL_NONE";
      poVar3 = str;
LAB_0026ab8b:
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
      bVar1 = false;
    }
    else {
      pcVar5 = getConfigAttribName(value);
      if (pcVar5 == (char *)0x0) {
        local_38 = CVar7;
        poVar3 = tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_38,str);
        lVar4 = 5;
        pcVar5 = ", ???";
        goto LAB_0026ab8b;
      }
      sVar2 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(str,pcVar5,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      local_38.value = fmt->attribs[iVar6 + 1];
      local_38.attribute = value;
      operator<<(str,&local_38);
      iVar6 = iVar6 + 2;
      bVar1 = true;
    }
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
      return str;
    }
  } while( true );
}

Assistant:

std::ostream& operator<< (std::ostream& str, const ConfigAttribListFmt& fmt)
{
	int pos = 0;

	str << "{ ";

	for (;;)
	{
		int attrib = fmt.attribs[pos];

		if (pos != 0)
			str << ", ";

		if (attrib == EGL_NONE)
		{
			// Terminate.
			str << "EGL_NONE";
			break;
		}

		const char*	attribName = getConfigAttribName(attrib);

		if (attribName)
		{
			// Valid attribute, print value.
			str << attribName << ", " << getConfigAttribValueStr(attrib, fmt.attribs[pos+1]);
			pos += 2;
		}
		else
		{
			// Invalid attribute. Terminate parsing.
			str << tcu::toHex(attrib) << ", ???";
			break;
		}
	}

	str << " }";
	return str;
}